

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall wabt::Var::set_name(Var *this,string *name)

{
  Destroy(this);
  this->type_ = Name;
  std::__cxx11::string::string((string *)&(this->field_2).name_,(string *)name);
  return;
}

Assistant:

void Var::set_name(std::string&& name) {
  Destroy();
  type_ = VarType::Name;
  Construct(name_, std::move(name));
}